

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderAdjacencyTests::createGridTriangleStrip
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  AdjacencyGrid *pAVar1;
  AdjacencyGridTriangle *pAVar2;
  uint uVar3;
  AdjacencyGridPoint *__s;
  ulong uVar4;
  GLfloat *pGVar5;
  AdjacencyGridTriangle *pAVar6;
  
  pAVar1 = test_data->m_grid;
  uVar3 = pAVar1->m_n_triangles * 6;
  (pAVar1->m_triangle_strip).m_n_points = uVar3;
  uVar4 = (ulong)uVar3 * 0xc;
  __s = (AdjacencyGridPoint *)operator_new__(uVar4);
  (pAVar1->m_triangle_strip).m_points = __s;
  memset(__s,0,uVar4);
  if (uVar3 != 0) {
    pAVar2 = pAVar1->m_triangles;
    uVar4 = 0;
    __s->index = 0;
    pGVar5 = &__s->x;
    pAVar6 = pAVar2;
    while( true ) {
      *(undefined8 *)pGVar5 = *(undefined8 *)&pAVar6->m_vertex_x->x;
      uVar4 = uVar4 + 1;
      if (uVar3 == uVar4) break;
      pGVar5[2] = (GLfloat)(int)uVar4;
      pAVar6 = (AdjacencyGridTriangle *)&pAVar2[(uVar4 & 0xffffffff) / 6].m_vertex_x_adjacent;
      pGVar5 = pGVar5 + 3;
    }
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::createGridTriangleStrip(AdjacencyTestData& test_data)
{
	/* For simplicity, reuse adjacency data we have already defined for single triangles.
	 * This does not make a correct topology, but our point is to verify that shaders
	 * are fed valid values (as per spec), not to confirm rendering works correctly.
	 */
	const int nVerticesPerTriangleStripPrimitive = 6;

	test_data.m_grid->m_triangle_strip.m_n_points =
		test_data.m_grid->m_n_triangles * nVerticesPerTriangleStripPrimitive;
	test_data.m_grid->m_triangle_strip.m_points = new AdjacencyGridPoint[test_data.m_grid->m_triangle_strip.m_n_points];

	memset(test_data.m_grid->m_triangle_strip.m_points, 0,
		   sizeof(AdjacencyGridPoint) * test_data.m_grid->m_triangle_strip.m_n_points);

	for (unsigned int n = 0; n < test_data.m_grid->m_triangle_strip.m_n_points; ++n)
	{
		AdjacencyGridPoint*	pointPtr		 = test_data.m_grid->m_triangle_strip.m_points + n;
		unsigned int		   triangleIndex = n / nVerticesPerTriangleStripPrimitive;
		AdjacencyGridTriangle* trianglePtr   = test_data.m_grid->m_triangles + triangleIndex;

		pointPtr->index = n;

		switch (n % nVerticesPerTriangleStripPrimitive)
		{
		case 0:
			pointPtr->x = trianglePtr->m_vertex_x->x;
			pointPtr->y = trianglePtr->m_vertex_x->y;
			break;
		case 1:
			pointPtr->x = trianglePtr->m_vertex_x_adjacent->x;
			pointPtr->y = trianglePtr->m_vertex_x_adjacent->y;
			break;
		case 2:
			pointPtr->x = trianglePtr->m_vertex_y->x;
			pointPtr->y = trianglePtr->m_vertex_y->y;
			break;
		case 3:
			pointPtr->x = trianglePtr->m_vertex_y_adjacent->x;
			pointPtr->y = trianglePtr->m_vertex_y_adjacent->y;
			break;
		case 4:
			pointPtr->x = trianglePtr->m_vertex_z->x;
			pointPtr->y = trianglePtr->m_vertex_z->y;
			break;
		case 5:
			pointPtr->x = trianglePtr->m_vertex_z_adjacent->x;
			pointPtr->y = trianglePtr->m_vertex_z_adjacent->y;
			break;
		}
	} /* for (all points) */
}